

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawPoly(Vector2 center,int sides,float radius,float rotation,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  float __x;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 local_9c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_58;
  undefined4 uStack_54;
  
  iVar3 = 3;
  if (3 < sides) {
    iVar3 = sides;
  }
  fVar6 = (float)iVar3;
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  local_58 = (float)uVar1;
  uStack_54 = SUB84(uVar1,4);
  uStack_84 = center.y;
  local_78 = (float)uVar2;
  uStack_74 = SUB84(uVar2,4);
  local_9c = rotation * 0.017453292;
  do {
    rlColor4ub(color.r,color.g,color.b,color.a);
    __x = (360.0 / fVar6) * 0.017453292 + local_9c;
    rlTexCoord2f(local_58 / (float)texShapes.width,uStack_54 / (float)texShapes.height);
    local_88 = center.x;
    rlVertex2f(local_88,uStack_84);
    rlTexCoord2f(local_58 / (float)texShapes.width,(uStack_74 + uStack_54) / (float)texShapes.height
                );
    fVar4 = cosf(local_9c);
    fVar5 = sinf(local_9c);
    rlVertex2f(fVar4 * radius + local_88,fVar5 * radius + uStack_84);
    rlTexCoord2f((local_78 + local_58) / (float)texShapes.width,uStack_54 / (float)texShapes.height)
    ;
    fVar4 = cosf(__x);
    fVar5 = sinf(__x);
    rlVertex2f(fVar4 * radius + local_88,fVar5 * radius + uStack_84);
    rlTexCoord2f((local_78 + local_58) / (float)texShapes.width,
                 (uStack_74 + uStack_54) / (float)texShapes.height);
    fVar4 = cosf(local_9c);
    fVar5 = sinf(local_9c);
    rlVertex2f(fVar4 * radius + local_88,fVar5 * radius + uStack_84);
    iVar3 = iVar3 + -1;
    local_9c = __x;
  } while (iVar3 != 0);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawPoly(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = rotation*DEG2RAD;
    float angleStep = 360.0f/(float)sides*DEG2RAD;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            float nextAngle = centralAngle + angleStep;

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(nextAngle)*radius, center.y + sinf(nextAngle)*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);

            centralAngle = nextAngle;
        }
    rlEnd();
    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + cosf(centralAngle + angleStep)*radius, center.y + sinf(centralAngle + angleStep)*radius);
            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);

            centralAngle += angleStep;
        }
    rlEnd();
#endif
}